

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow *window)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ImGuiContext *g;
  float fVar4;
  ImVec2 IVar5;
  undefined1 auVar6 [16];
  float fVar7;
  undefined1 auVar8 [16];
  float fVar9;
  undefined1 auVar10 [16];
  
  IVar5 = window->Scroll;
  fVar7 = (window->ScrollTarget).x;
  if (fVar7 < 3.4028235e+38) {
    fVar9 = (window->ScrollTargetCenterRatio).x;
    fVar1 = (window->ScrollTargetEdgeSnapDist).x;
    if (0.0 < fVar1) {
      if (fVar7 <= fVar1) {
        fVar7 = fVar7 * fVar9 + 0.0;
      }
      else {
        fVar2 = (window->ScrollMax).x + (window->Size).x;
        if (fVar2 - fVar1 <= fVar7) {
          fVar7 = (fVar2 - fVar7) * fVar9 + fVar7;
        }
      }
    }
    IVar5.y = IVar5.y;
    IVar5.x = fVar7 - fVar9 * ((window->SizeFull).x - (window->ScrollbarSizes).x);
  }
  auVar10._8_8_ = 0;
  auVar10._0_4_ = IVar5.x;
  auVar10._4_4_ = IVar5.y;
  if ((window->ScrollTarget).y < 3.4028235e+38) {
    fVar7 = 0.0;
    if ((window->Flags & 1) == 0) {
      fVar7 = GImGui->FontBaseSize * window->FontWindowScale;
      if (window->ParentWindow != (ImGuiWindow *)0x0) {
        fVar7 = fVar7 * window->ParentWindow->FontWindowScale;
      }
      fVar9 = (GImGui->Style).FramePadding.y;
      fVar7 = fVar9 + fVar9 + fVar7;
    }
    fVar4 = ImGuiWindow::MenuBarHeight(window);
    fVar9 = (window->ScrollTarget).y;
    fVar1 = (window->ScrollTargetCenterRatio).y;
    fVar2 = (window->ScrollTargetEdgeSnapDist).y;
    if (0.0 < fVar2) {
      if (fVar9 <= fVar2) {
        fVar9 = fVar9 * fVar1 + 0.0;
      }
      else {
        fVar3 = ((window->ScrollMax).y + (window->Size).y) - (fVar4 + fVar7);
        if (fVar3 - fVar2 <= fVar9) {
          fVar9 = (fVar3 - fVar9) * fVar1 + fVar9;
        }
      }
    }
    auVar10 = vinsertps_avx(auVar10,ZEXT416((uint)(fVar9 - fVar1 * (((window->SizeFull).y -
                                                                    (window->ScrollbarSizes).y) -
                                                                   (fVar4 + fVar7)))),0x10);
  }
  auVar6 = vcmpps_avx(ZEXT416(0) << 0x20,auVar10,2);
  auVar10 = vandps_avx(auVar6,auVar10);
  auVar6._0_4_ = (int)auVar10._0_4_;
  auVar6._4_4_ = (int)auVar10._4_4_;
  auVar6._8_4_ = (int)auVar10._8_4_;
  auVar6._12_4_ = (int)auVar10._12_4_;
  auVar10 = vcvtdq2ps_avx(auVar6);
  IVar5 = auVar10._0_8_;
  if ((window->Collapsed == false) && (window->SkipItems == false)) {
    auVar8._8_8_ = 0;
    auVar8._0_4_ = (window->ScrollMax).x;
    auVar8._4_4_ = (window->ScrollMax).y;
    auVar10 = vminps_avx(auVar10,auVar8);
    IVar5 = auVar10._0_8_;
  }
  return IVar5;
}

Assistant:

static ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow* window)
{
    ImVec2 scroll = window->Scroll;
    if (window->ScrollTarget.x < FLT_MAX)
    {
        float center_x_ratio = window->ScrollTargetCenterRatio.x;
        float scroll_target_x = window->ScrollTarget.x;
        float snap_x_min = 0.0f;
        float snap_x_max = window->ScrollMax.x + window->Size.x;
        if (window->ScrollTargetEdgeSnapDist.x > 0.0f)
            scroll_target_x = CalcScrollEdgeSnap(scroll_target_x, snap_x_min, snap_x_max, window->ScrollTargetEdgeSnapDist.x, center_x_ratio);
        scroll.x = scroll_target_x - center_x_ratio * (window->SizeFull.x - window->ScrollbarSizes.x);
    }
    if (window->ScrollTarget.y < FLT_MAX)
    {
        float decoration_up_height = window->TitleBarHeight() + window->MenuBarHeight();
        float center_y_ratio = window->ScrollTargetCenterRatio.y;
        float scroll_target_y = window->ScrollTarget.y;
        float snap_y_min = 0.0f;
        float snap_y_max = window->ScrollMax.y + window->Size.y - decoration_up_height;
        if (window->ScrollTargetEdgeSnapDist.y > 0.0f)
            scroll_target_y = CalcScrollEdgeSnap(scroll_target_y, snap_y_min, snap_y_max, window->ScrollTargetEdgeSnapDist.y, center_y_ratio);
        scroll.y = scroll_target_y - center_y_ratio * (window->SizeFull.y - window->ScrollbarSizes.y - decoration_up_height);
    }
    scroll.x = IM_FLOOR(ImMax(scroll.x, 0.0f));
    scroll.y = IM_FLOOR(ImMax(scroll.y, 0.0f));
    if (!window->Collapsed && !window->SkipItems)
    {
        scroll.x = ImMin(scroll.x, window->ScrollMax.x);
        scroll.y = ImMin(scroll.y, window->ScrollMax.y);
    }
    return scroll;
}